

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

lys_module * yin_read_module(ly_ctx *ctx,char *data,char *revision,int implement)

{
  lyxml_elem *yin;
  lys_module *plVar1;
  LY_ERR *pLVar2;
  
  yin = lyxml_parse_mem(ctx,data,2);
  if (yin == (lyxml_elem *)0x0) {
    pLVar2 = ly_errno_glob_address();
    ly_log(ctx,LY_LLERR,*pLVar2,"Module parsing failed.");
    plVar1 = (lys_module *)0x0;
  }
  else {
    plVar1 = yin_read_module_(ctx,yin,revision,implement);
    lyxml_free(ctx,yin);
  }
  return plVar1;
}

Assistant:

struct lys_module *
yin_read_module(struct ly_ctx *ctx, const char *data, const char *revision, int implement)
{
    struct lyxml_elem *yin;
    struct lys_module *result;

    yin = lyxml_parse_mem(ctx, data, LYXML_PARSE_NOMIXEDCONTENT);
    if (!yin) {
        LOGERR(ctx, ly_errno, "Module parsing failed.");
        return NULL;
    }

    result = yin_read_module_(ctx, yin, revision, implement);

    lyxml_free(ctx, yin);

    return result;
}